

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_connect_common(Curl_easy *data,connectdata *conn,int sockindex,_Bool nonblocking,
                            _Bool *done)

{
  curl_socket_t cVar1;
  ssl_connection_state sVar2;
  ssl_backend_data *psVar3;
  ssl_backend_data *psVar4;
  ulong uVar5;
  hostname *phVar6;
  ssl_config_data *psVar7;
  ssl_config_data *psVar8;
  ssl_config_data *psVar9;
  byte bVar10;
  byte bVar11;
  uchar uVar12;
  _Bool _Var13;
  int iVar14;
  uint uVar15;
  CURLcode CVar16;
  int iVar17;
  uint uVar18;
  CURLcode CVar19;
  int iVar20;
  long lVar21;
  timediff_t tVar22;
  char *pcVar23;
  SSL_CIPHER *c;
  char *pcVar24;
  uint *puVar25;
  ulong uVar26;
  SSL_METHOD *meth;
  SSL_CTX *pSVar27;
  BIO_METHOD *pBVar28;
  BIO *pBVar29;
  X509 *pXVar30;
  X509_NAME *pXVar31;
  ASN1_TIME *pAVar32;
  int *piVar33;
  curl_blob **ppcVar34;
  curl_blob *pcVar35;
  stack_st_X509_INFO *psVar36;
  undefined8 *puVar37;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar38;
  uchar *pubkey;
  OCSP_BASICRESP *bs;
  stack_st_X509 *certs;
  X509_STORE *pXVar39;
  X509 *pXVar40;
  X509 *issuer;
  EVP_MD *dgst;
  OCSP_CERTID *id;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *ssl;
  long lVar41;
  connectdata *pcVar42;
  curl_socket_t writefd;
  long lVar43;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  size_t size_07;
  size_t size_08;
  char cVar44;
  long lVar45;
  curl_socket_t readfd0;
  long lVar46;
  undefined8 in_R10;
  char **ppcVar47;
  ssl_connect_state sVar48;
  char **ppcVar49;
  bool bVar50;
  char *local_9f8;
  char *local_9e0;
  curl_blob *local_9d8;
  int cert_status;
  char *local_9c8;
  char *local_9c0;
  curl_blob *local_9b8;
  int crl_reason;
  char *local_9a8;
  char *local_9a0;
  undefined8 local_998;
  BIO *local_990;
  void *ssl_sessionid;
  curl_socket_t local_97c;
  _Bool *local_978;
  long local_970;
  in6_addr addr;
  char *local_958;
  ASN1_GENERALIZEDTIME *local_950;
  ASN1_GENERALIZEDTIME *thisupd;
  ASN1_GENERALIZEDTIME *rev;
  char extramsg [80];
  char error_buffer [256];
  
  lVar21 = (long)sockindex;
  if (conn->ssl[lVar21].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  cVar1 = conn->sock[lVar21];
  sVar48 = conn->ssl[lVar21].connecting_state;
  local_978 = done;
  local_970 = lVar21;
  if (sVar48 == ssl_connect_1) {
    tVar22 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar22 < 0) {
LAB_0014065d:
      Curl_failf(data,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    local_97c = conn->sock[local_970];
    ssl_sessionid = (void *)0x0;
    if ((conn->http_proxy).proxytype == '\x02') {
      sVar2 = conn->proxy_ssl[conn->sock[1] != -1].state;
      if (sVar2 == ssl_connection_complete) {
        local_9a8 = (conn->host).name;
        lVar41 = 0x280;
        lVar43 = 0x568;
        lVar45 = 0x590;
        lVar46 = 0x2d8;
      }
      else {
        local_9a8 = (conn->http_proxy).host.name;
        lVar41 = 0x2f8;
        lVar43 = 0x628;
        lVar45 = 0x650;
        lVar46 = 0x350;
      }
      local_9f8 = *(char **)((conn->chunk).hexbuffer + lVar41 + -0x3d);
      local_990 = *(BIO **)((long)&data->magic + lVar43);
      local_9d8 = *(curl_blob **)((long)&data->magic + lVar45);
      pcVar35 = *(curl_blob **)((conn->chunk).hexbuffer + lVar46 + -0x3d);
      local_9b8 = (curl_blob *)0x0;
      if (sVar2 == ssl_connection_complete) {
        local_9e0 = (data->set).ssl.cert_type;
        lVar41 = 0x588;
        lVar43 = 0x2f1;
        lVar45 = 0x290;
        if (pcVar35 == (curl_blob *)0x0) {
          local_998 = CONCAT71((int7)((ulong)local_9e0 >> 8),1);
          goto LAB_001406da;
        }
      }
      else {
        local_9e0 = (data->set).proxy_ssl.cert_type;
        lVar41 = 0x648;
        lVar43 = 0x369;
        lVar45 = 0x308;
        if (pcVar35 == (curl_blob *)0x0) {
          local_998 = CONCAT71((int7)((ulong)local_9e0 >> 8),1);
          lVar46 = 0x310;
          goto LAB_00140870;
        }
      }
      local_998 = 0;
      local_9b8 = pcVar35;
LAB_00140731:
      local_9c8 = (char *)0x0;
    }
    else {
      local_9a8 = (conn->host).name;
      local_9f8 = (char *)(conn->ssl_config).version;
      local_9b8 = (conn->ssl_config).ca_info_blob;
      local_990 = (BIO *)(data->set).ssl.primary.clientcert;
      local_9d8 = (data->set).ssl.primary.cert_blob;
      local_9e0 = (data->set).ssl.cert_type;
      lVar41 = 0x588;
      lVar43 = 0x2f1;
      lVar45 = 0x290;
      local_998 = CONCAT71((int7)((ulong)in_R10 >> 8),local_9b8 == (curl_blob *)0x0);
      if (local_9b8 != (curl_blob *)0x0) goto LAB_00140731;
LAB_001406da:
      lVar45 = 0x290;
      lVar43 = 0x2f1;
      lVar41 = 0x588;
      lVar46 = 0x298;
LAB_00140870:
      local_9c8 = *(char **)((conn->chunk).hexbuffer + lVar46 + -0x3d);
    }
    local_9a0 = *(char **)((conn->chunk).hexbuffer + lVar45 + -0x3d);
    bVar10 = (conn->chunk).hexbuffer[lVar43 + -0x3d];
    local_9c0 = *(char **)((long)&data->magic + lVar41);
    psVar3 = conn->ssl[lVar21].backend;
    CVar16 = ossl_seed(data);
    if (CVar16 != CURLE_OK) {
      return CVar16;
    }
    if (((conn->http_proxy).proxytype != '\x02') ||
       (lVar41 = 0x678, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar41 = 0x5b8;
    }
    *(undefined8 *)((long)&data->magic + lVar41) = 1;
    if (7 < local_9f8) {
      Curl_failf(data,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    CVar16 = CURLE_NOT_BUILT_IN;
    if ((0xf3UL >> ((ulong)local_9f8 & 0x3f) & 1) == 0) {
      if (local_9f8 == (char *)0x2) {
        pcVar23 = "No SSLv2 support";
      }
      else {
        pcVar23 = "No SSLv3 support";
      }
      goto LAB_00140d05;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar27 = SSL_CTX_new(meth);
    psVar3->ctx = (SSL_CTX *)pSVar27;
    if (pSVar27 == (SSL_CTX *)0x0) {
      uVar26 = ERR_peek_error();
      ossl_strerror(uVar26,error_buffer,size_00);
      Curl_failf(data,"SSL: couldn\'t create a context: %s",error_buffer);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar27,0x21,0x10,(void *)0x0);
    if (((data->set).fdebug != (curl_debug_callback)0x0) && (((data->set).field_0x8e5 & 8) != 0)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)psVar3->ctx,ossl_trace);
      SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x10,0,conn);
      (conn->ssl[0].backend)->logger = data;
    }
    uVar12 = (conn->http_proxy).proxytype;
    if (((uVar12 == '\x02') &&
        (iVar14 = conn->sock[1], conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete)) &&
       (((data->set).proxy_ssl.field_0xb8 & 4) != 0)) {
      if (((ulong)local_9f8 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar27 = (SSL_CTX *)psVar3->ctx;
LAB_00140f3b:
      lVar41 = 0x2f8;
      if (conn->proxy_ssl[iVar14 != -1].state == ssl_connection_complete) {
        lVar41 = 0x280;
      }
    }
    else {
      if (((ulong)local_9f8 & 0xfffffffffffffffe) == 2) {
        return CURLE_NOT_BUILT_IN;
      }
      pSVar27 = (SSL_CTX *)psVar3->ctx;
      lVar41 = 0x280;
      if (uVar12 == '\x02') {
        iVar14 = conn->sock[1];
        goto LAB_00140f3b;
      }
    }
    switch(*(undefined8 *)((conn->chunk).hexbuffer + lVar41 + -0x3d)) {
    case 0:
      goto switchD_00140f79_caseD_0;
    case 1:
    case 4:
      lVar41 = 0x301;
      break;
    default:
      lVar41 = 0;
      break;
    case 5:
      lVar41 = 0x302;
      break;
    case 6:
      lVar41 = 0x303;
      break;
    case 7:
      lVar41 = 0x304;
    }
    lVar41 = SSL_CTX_ctrl(pSVar27,0x7b,lVar41,(void *)0x0);
    if (lVar41 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    uVar12 = (conn->http_proxy).proxytype;
switchD_00140f79_caseD_0:
    if ((uVar12 != '\x02') ||
       (lVar41 = 0x300, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar41 = 0x288;
    }
    uVar26 = *(ulong *)((conn->chunk).hexbuffer + lVar41 + -0x3d);
    uVar5 = uVar26 << 0x30;
    uVar26 = uVar26 >> 0x10;
    lVar41 = (uVar5 | uVar26) + 0x2fd;
    if ((uVar5 | uVar26 & 0xfffffffffffffffc) != 4) {
      lVar41 = 0;
    }
    lVar41 = SSL_CTX_ctrl(pSVar27,0x7c,lVar41,(void *)0x0);
    CVar16 = CURLE_SSL_CONNECT_ERROR;
    if (lVar41 == 0) {
      return CURLE_SSL_CONNECT_ERROR;
    }
    SSL_CTX_set_options(psVar3->ctx);
    uVar15 = *(uint *)&(conn->bits).field_0x4;
    if ((uVar15 >> 0x1a & 1) != 0) {
      lVar41 = 0;
      if (2 < (data->state).httpwant) {
        pcVar42 = conn;
        if ((conn->http_proxy).proxytype == '\x02') {
          pcVar42 = (connectdata *)0x0;
          if (((uVar15 & 8) != 0) &&
             (pcVar42 = conn, conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)
             ) goto LAB_00141217;
        }
        extramsg[0] = '\x02';
        extramsg[1] = 'h';
        extramsg[2] = '2';
        Curl_infof(data,"ALPN: offers %s","h2",pcVar42);
        lVar41 = 3;
      }
LAB_00141217:
      builtin_strncpy(extramsg + lVar41,"\bhttp/1.1",9);
      Curl_infof(data,"ALPN: offers %s","http/1.1");
      iVar14 = SSL_CTX_set_alpn_protos(psVar3->ctx,extramsg,(int)lVar41 + 9);
      if (iVar14 != 0) {
        pcVar23 = "Error setting ALPN";
        goto LAB_00140d05;
      }
    }
    if ((local_990 != (BIO *)0x0 || local_9d8 != (curl_blob *)0x0) || local_9e0 != (char *)0x0) {
      if ((conn->http_proxy).proxytype == '\x02') {
        psVar7 = &(data->set).ssl;
        psVar8 = &(data->set).ssl;
        psVar9 = &(data->set).ssl;
        bVar50 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar50) {
          psVar9 = &(data->set).proxy_ssl;
          psVar7 = &(data->set).proxy_ssl;
          psVar8 = &(data->set).proxy_ssl;
        }
        ppcVar34 = &psVar8->key_blob;
        ppcVar49 = &psVar7->key;
        ppcVar47 = &psVar9->key_type;
        lVar41 = 0x6b0;
        if (bVar50) {
          lVar41 = 0x5f0;
        }
      }
      else {
        ppcVar49 = &(data->set).ssl.key;
        ppcVar34 = &(data->set).ssl.key_blob;
        ppcVar47 = &(data->set).ssl.key_type;
        lVar41 = 0x5f0;
      }
      iVar14 = cert_stuff(data,psVar3->ctx,(char *)local_990,local_9d8,local_9e0,*ppcVar49,*ppcVar34
                          ,*ppcVar47,*(char **)((long)&data->magic + lVar41));
      if (iVar14 == 0) {
        return CURLE_SSL_CERTPROBLEM;
      }
    }
    uVar12 = (conn->http_proxy).proxytype;
    if ((uVar12 != '\x02') ||
       (lVar41 = 0x328, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar41 = 0x2b0;
    }
    pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar41 + -0x3d);
    if (pcVar23 != (char *)0x0) {
      iVar14 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar3->ctx,pcVar23);
      if (iVar14 == 0) {
        pcVar24 = "failed setting cipher list: %s";
        goto LAB_0014184c;
      }
      Curl_infof(data,"Cipher selection: %s",pcVar23);
      uVar12 = (conn->http_proxy).proxytype;
    }
    if ((uVar12 != '\x02') ||
       (lVar41 = 0x330, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar41 = 0x2b8;
    }
    pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar41 + -0x3d);
    if (pcVar23 != (char *)0x0) {
      iVar14 = SSL_CTX_set_ciphersuites(psVar3->ctx,pcVar23);
      if (iVar14 == 0) {
        pcVar24 = "failed setting TLS 1.3 cipher suite: %s";
        goto LAB_0014184c;
      }
      Curl_infof(data,"TLS 1.3 cipher selection: %s",pcVar23);
    }
    sVar48 = ssl_connect_2;
    SSL_CTX_set_post_handshake_auth(psVar3->ctx,1);
    if (((conn->http_proxy).proxytype != '\x02') ||
       (lVar41 = 0x360, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar41 = 0x2e8;
    }
    pcVar23 = *(char **)((conn->chunk).hexbuffer + lVar41 + -0x3d);
    if ((pcVar23 != (char *)0x0) &&
       (lVar41 = SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x5c,0,pcVar23), lVar41 == 0)) {
      pcVar24 = "failed setting curves list: \'%s\'";
LAB_0014184c:
      Curl_failf(data,pcVar24,pcVar23);
      return CURLE_SSL_CIPHER;
    }
    uVar15 = bVar10 & 1;
    cVar44 = (char)uVar15;
    if ((char)local_998 == '\0') {
      if (local_9b8->len < 0x80000000) {
        pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
        CVar19 = CURLE_OUT_OF_MEMORY;
        if ((pXVar39 == (X509_STORE *)0x0) ||
           (pBVar29 = BIO_new_mem_buf(local_9b8->data,(int)local_9b8->len), pBVar29 == (BIO *)0x0))
        goto LAB_0014193b;
        psVar36 = PEM_X509_INFO_read_bio
                            (pBVar29,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
        if (psVar36 == (stack_st_X509_INFO *)0x0) {
          BIO_free(pBVar29);
        }
        else {
          iVar14 = 0;
          local_990 = pBVar29;
          for (iVar20 = 0; iVar17 = OPENSSL_sk_num(psVar36), iVar20 < iVar17; iVar20 = iVar20 + 1) {
            puVar37 = (undefined8 *)OPENSSL_sk_value(psVar36,iVar20);
            if ((X509 *)*puVar37 != (X509 *)0x0) {
              iVar17 = X509_STORE_add_cert(pXVar39,(X509 *)*puVar37);
              if (iVar17 != 0) {
                iVar14 = iVar14 + 1;
                goto LAB_0014190b;
              }
LAB_00142204:
              iVar14 = 0;
              break;
            }
LAB_0014190b:
            if ((X509_CRL *)puVar37[1] != (X509_CRL *)0x0) {
              iVar17 = X509_STORE_add_crl(pXVar39,(X509_CRL *)puVar37[1]);
              if (iVar17 == 0) goto LAB_00142204;
              iVar14 = iVar14 + 1;
            }
          }
          OPENSSL_sk_pop_free(psVar36,X509_INFO_free);
          BIO_free(local_990);
          if (0 < iVar14) goto LAB_001414d4;
        }
      }
      if (cVar44 != '\0') {
        CVar19 = CURLE_SSL_CACERT_BADFILE;
LAB_0014193b:
        Curl_failf(data,"error importing CA certificate blob");
        return CVar19;
      }
      Curl_infof(data,"error importing CA certificate blob, continuing anyway");
    }
    else {
LAB_001414d4:
      if ((cVar44 != '\0') && (local_9c8 != (char *)0x0 || local_9a0 != (char *)0x0)) {
        if ((local_9c8 != (char *)0x0) &&
           (iVar14 = SSL_CTX_load_verify_file(psVar3->ctx,local_9c8), iVar14 == 0)) {
          pcVar24 = "error setting certificate file: %s";
          pcVar23 = local_9c8;
LAB_00142255:
          Curl_failf(data,pcVar24,pcVar23);
          return CURLE_SSL_CACERT_BADFILE;
        }
        local_9f8 = "none";
        if (local_9a0 != (char *)0x0) {
          iVar14 = SSL_CTX_load_verify_dir(psVar3->ctx,local_9a0);
          if (iVar14 == 0) {
            pcVar24 = "error setting certificate path: %s";
            pcVar23 = local_9a0;
            goto LAB_00142255;
          }
          local_9f8 = local_9a0;
        }
        pcVar23 = "none";
        if (local_9c8 != (char *)0x0) {
          pcVar23 = local_9c8;
        }
        Curl_infof(data," CAfile: %s",pcVar23);
        Curl_infof(data," CApath: %s",local_9f8);
      }
    }
    if (local_9c0 != (char *)0x0) {
      pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      m = X509_LOOKUP_file();
      ctx = X509_STORE_add_lookup(pXVar39,m);
      if ((ctx == (X509_LOOKUP *)0x0) || (iVar14 = X509_load_crl_file(ctx,local_9c0,1), iVar14 == 0)
         ) {
        Curl_failf(data,"error loading CRL file: %s",local_9c0);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(data,"successfully loaded CRL file:");
      pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar39,0xc);
      Curl_infof(data,"  CRLfile: %s",local_9c0);
    }
    if (cVar44 != '\0') {
      pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
      X509_STORE_set_flags(pXVar39,0x8000);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if (local_9c0 == (char *)0x0) {
          bVar10 = (data->set).proxy_ssl.field_0xb8;
LAB_00141f74:
          if ((bVar10 & 0x10) == 0) {
            pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar3->ctx);
            X509_STORE_set_flags(pXVar39,0x80000);
          }
        }
      }
      else if (local_9c0 == (char *)0x0) {
        bVar10 = (data->set).ssl.field_0xb8;
        goto LAB_00141f74;
      }
    }
    SSL_CTX_set_verify((SSL_CTX *)psVar3->ctx,uVar15,(callback *)0x0);
    _Var13 = Curl_tls_keylog_enabled();
    if (_Var13) {
      SSL_CTX_set_keylog_callback(psVar3->ctx,ossl_keylog_callback);
    }
    SSL_CTX_ctrl((SSL_CTX *)psVar3->ctx,0x2c,0x301,(void *)0x0);
    SSL_CTX_sess_set_new_cb((SSL_CTX *)psVar3->ctx,ossl_new_session_cb);
    if ((data->set).ssl.fsslctx != (curl_ssl_ctx_callback)0x0) {
      Curl_set_in_callback(data,true);
      CVar19 = (*(data->set).ssl.fsslctx)(data,psVar3->ctx,(data->set).ssl.fsslctxp);
      Curl_set_in_callback(data,false);
      if (CVar19 != CURLE_OK) {
        Curl_failf(data,"error signaled by ssl ctx callback");
        return CVar19;
      }
    }
    if ((SSL *)psVar3->handle != (SSL *)0x0) {
      SSL_free((SSL *)psVar3->handle);
    }
    ssl = SSL_new((SSL_CTX *)psVar3->ctx);
    psVar3->handle = (SSL *)ssl;
    if (ssl == (SSL *)0x0) {
      Curl_failf(data,"SSL: couldn\'t create a context (handle)");
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x71;
    }
    if ((bVar10 & 4) != 0) {
      SSL_ctrl(ssl,0x41,1,(void *)0x0);
      ssl = (SSL *)psVar3->handle;
    }
    SSL_set_connect_state(ssl);
    pcVar23 = local_9a8;
    psVar3->server_cert = (X509 *)0x0;
    iVar14 = inet_pton(2,local_9a8,&addr);
    if (((iVar14 == 0) && (iVar14 = inet_pton(10,pcVar23,&addr), iVar14 == 0)) &&
       ((pcVar23 = Curl_ssl_snihost(data,pcVar23,(size_t *)0x0), pcVar23 == (char *)0x0 ||
        (lVar41 = SSL_ctrl((SSL *)psVar3->handle,0x37,0,pcVar23), lVar41 == 0)))) {
      pcVar23 = "Failed set SNI";
LAB_00140d05:
      Curl_failf(data,pcVar23);
      return CVar16;
    }
    _Var13 = ossl_associate_connection(data,conn,sockindex);
    if (!_Var13) {
      uVar26 = ERR_get_error();
      ossl_strerror(uVar26,error_buffer,size_06);
      pcVar23 = "SSL: ossl_associate_connection failed: %s";
LAB_0014218e:
      Curl_failf(data,pcVar23,error_buffer);
      return CURLE_SSL_CONNECT_ERROR;
    }
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (data->set).proxy_ssl.primary.field_0x71;
    }
    else {
      bVar10 = (data->set).ssl.primary.field_0x71;
    }
    if ((bVar10 & 8) != 0) {
      Curl_ssl_sessionid_lock(data);
      if ((conn->http_proxy).proxytype == '\x02') {
        _Var13 = conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete;
      }
      else {
        _Var13 = false;
      }
      _Var13 = Curl_ssl_getsessionid(data,conn,_Var13,&ssl_sessionid,(size_t *)0x0,sockindex);
      if (!_Var13) {
        iVar14 = SSL_set_session((SSL *)psVar3->handle,(SSL_SESSION *)ssl_sessionid);
        if (iVar14 == 0) {
          Curl_ssl_sessionid_unlock(data);
          uVar26 = ERR_get_error();
          ossl_strerror(uVar26,error_buffer,size_08);
          pcVar23 = "SSL: SSL_set_session failed: %s";
          goto LAB_0014218e;
        }
        Curl_infof(data,"SSL re-using session ID");
      }
      Curl_ssl_sessionid_unlock(data);
    }
    if ((conn->proxy_ssl[lVar21].field_0x10 & 1) == 0) {
      iVar14 = SSL_set_fd((SSL *)psVar3->handle,local_97c);
      if (iVar14 == 0) {
        uVar26 = ERR_get_error();
        ossl_strerror(uVar26,error_buffer,size_07);
        pcVar23 = "SSL: SSL_set_fd failed: %s";
        goto LAB_0014218e;
      }
    }
    else {
      pBVar28 = BIO_f_ssl();
      pBVar29 = BIO_new(pBVar28);
      BIO_ctrl(pBVar29,0x6d,0,(conn->proxy_ssl[lVar21].backend)->handle);
      SSL_set_bio((SSL *)psVar3->handle,pBVar29,pBVar29);
    }
    conn->ssl[lVar21].connecting_state = ssl_connect_2;
  }
  while (sVar48 - ssl_connect_2 < 3) {
    tVar22 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar22 < 0) goto LAB_0014065d;
    sVar48 = conn->ssl[lVar21].connecting_state;
    if ((sVar48 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar48 == ssl_connect_2_writing) {
        writefd = cVar1;
      }
      readfd0 = -1;
      if (sVar48 == ssl_connect_2_reading) {
        readfd0 = cVar1;
      }
      if (nonblocking) {
        tVar22 = 0;
      }
      iVar14 = Curl_socket_check(readfd0,-1,writefd,tVar22);
      if (iVar14 < 0) {
        puVar25 = (uint *)__errno_location();
        Curl_failf(data,"select/poll on SSL socket, errno: %d",(ulong)*puVar25);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar14 == 0) {
        if (nonblocking) {
          *local_978 = false;
          return CURLE_OK;
        }
        goto LAB_0014065d;
      }
    }
    psVar3 = conn->ssl[lVar21].backend;
    ERR_clear_error();
    iVar14 = SSL_connect((SSL *)psVar3->handle);
    if (iVar14 == 1) {
      conn->ssl[lVar21].connecting_state = ssl_connect_3;
      pcVar23 = SSL_get_version((SSL *)psVar3->handle);
      c = SSL_get_current_cipher((SSL *)psVar3->handle);
      pcVar24 = SSL_CIPHER_get_name(c);
      Curl_infof(data,"SSL connection using %s / %s",pcVar23,pcVar24);
      if (((conn->bits).field_0x7 & 4) != 0) {
        SSL_get0_alpn_selected(psVar3->handle,error_buffer,extramsg);
        if (extramsg._0_4_ == 0) {
          Curl_infof(data,"ALPN: server did not agree on a protocol. Uses default.");
        }
        else {
          Curl_infof(data,"ALPN: server accepted %.*s",extramsg._0_8_ & 0xffffffff,
                     error_buffer._0_8_);
          if (extramsg._0_4_ == 8) {
            if (*(long *)error_buffer._0_8_ == 0x312e312f70747468) {
              conn->alpn = '\x02';
            }
          }
          else if ((extramsg._0_4_ == 2) && (*(short *)error_buffer._0_8_ == 0x3268)) {
            conn->alpn = '\x03';
          }
        }
        Curl_multiuse_state(data,(uint)(conn->alpn == '\x03') * 3 + -1);
      }
    }
    else {
      iVar14 = SSL_get_error((SSL *)psVar3->handle,iVar14);
      if (iVar14 == 9) {
        conn->ssl[lVar21].connecting_state = ssl_connect_2;
      }
      else if (iVar14 == 3) {
        conn->ssl[lVar21].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (iVar14 != 2) {
          memset(error_buffer,0,0x100);
          conn->ssl[lVar21].connecting_state = ssl_connect_2;
          uVar26 = ERR_get_error();
          uVar15 = (uint)uVar26;
          if ((uVar15 & 0xff800000) == 0xa000000 && -1 < (int)uVar15) {
            uVar15 = uVar15 & 0x7fffff;
            if (uVar15 != 0x86) {
              if (uVar15 == 0x45c) {
                ossl_strerror(uVar26,error_buffer,size);
                CVar16 = CURLE_SSL_CLIENTCERT;
                goto LAB_001411f4;
              }
              if (uVar15 != 0x415) goto LAB_00140a42;
            }
            lVar21 = SSL_get_verify_result((SSL *)psVar3->handle);
            if (lVar21 == 0) {
              builtin_strncpy(error_buffer,"SSL certificate verification failed",0x24);
              CVar16 = CURLE_PEER_FAILED_VERIFICATION;
            }
            else {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar41 = 0x678,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar41 = 0x5b8;
              }
              *(long *)((long)&data->magic + lVar41) = lVar21;
              pcVar23 = X509_verify_cert_error_string(lVar21);
              curl_msnprintf(error_buffer,0x100,"SSL certificate problem: %s",pcVar23);
              CVar16 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_001411f4:
            Curl_failf(data,"%s",error_buffer);
            return CVar16;
          }
LAB_00140a42:
          ossl_strerror(uVar26,error_buffer,size);
          CVar16 = CURLE_SSL_CONNECT_ERROR;
          if (uVar26 != 0) goto LAB_001411f4;
          if ((conn->http_proxy).proxytype == '\x02') {
            bVar50 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            phVar6 = &(conn->http_proxy).host;
            if (bVar50) {
              phVar6 = &conn->host;
            }
            lVar21 = (ulong)bVar50 * 4 + 0x568;
          }
          else {
            phVar6 = &conn->host;
            lVar21 = 0x56c;
          }
          pcVar23 = phVar6->name;
          iVar20 = *(int *)((conn->chunk).hexbuffer + lVar21 + -0x3d);
          extramsg[0x40] = '\0';
          extramsg[0x41] = '\0';
          extramsg[0x42] = '\0';
          extramsg[0x43] = '\0';
          extramsg[0x44] = '\0';
          extramsg[0x45] = '\0';
          extramsg[0x46] = '\0';
          extramsg[0x47] = '\0';
          extramsg[0x48] = '\0';
          extramsg[0x49] = '\0';
          extramsg[0x4a] = '\0';
          extramsg[0x4b] = '\0';
          extramsg[0x4c] = '\0';
          extramsg[0x4d] = '\0';
          extramsg[0x4e] = '\0';
          extramsg[0x4f] = '\0';
          extramsg[0x30] = '\0';
          extramsg[0x31] = '\0';
          extramsg[0x32] = '\0';
          extramsg[0x33] = '\0';
          extramsg[0x34] = '\0';
          extramsg[0x35] = '\0';
          extramsg[0x36] = '\0';
          extramsg[0x37] = '\0';
          extramsg[0x38] = '\0';
          extramsg[0x39] = '\0';
          extramsg[0x3a] = '\0';
          extramsg[0x3b] = '\0';
          extramsg[0x3c] = '\0';
          extramsg[0x3d] = '\0';
          extramsg[0x3e] = '\0';
          extramsg[0x3f] = '\0';
          extramsg[0x20] = '\0';
          extramsg[0x21] = '\0';
          extramsg[0x22] = '\0';
          extramsg[0x23] = '\0';
          extramsg[0x24] = '\0';
          extramsg[0x25] = '\0';
          extramsg[0x26] = '\0';
          extramsg[0x27] = '\0';
          extramsg[0x28] = '\0';
          extramsg[0x29] = '\0';
          extramsg[0x2a] = '\0';
          extramsg[0x2b] = '\0';
          extramsg[0x2c] = '\0';
          extramsg[0x2d] = '\0';
          extramsg[0x2e] = '\0';
          extramsg[0x2f] = '\0';
          extramsg[0x10] = '\0';
          extramsg[0x11] = '\0';
          extramsg[0x12] = '\0';
          extramsg[0x13] = '\0';
          extramsg[0x14] = '\0';
          extramsg[0x15] = '\0';
          extramsg[0x16] = '\0';
          extramsg[0x17] = '\0';
          extramsg[0x18] = '\0';
          extramsg[0x19] = '\0';
          extramsg[0x1a] = '\0';
          extramsg[0x1b] = '\0';
          extramsg[0x1c] = '\0';
          extramsg[0x1d] = '\0';
          extramsg[0x1e] = '\0';
          extramsg[0x1f] = '\0';
          extramsg[0] = '\0';
          extramsg[1] = '\0';
          extramsg[2] = '\0';
          extramsg[3] = '\0';
          extramsg[4] = '\0';
          extramsg[5] = '\0';
          extramsg[6] = '\0';
          extramsg[7] = '\0';
          extramsg[8] = '\0';
          extramsg[9] = '\0';
          extramsg[10] = '\0';
          extramsg[0xb] = '\0';
          extramsg[0xc] = '\0';
          extramsg[0xd] = '\0';
          extramsg[0xe] = '\0';
          extramsg[0xf] = '\0';
          piVar33 = __errno_location();
          if (iVar14 == 5 && *piVar33 != 0) {
            Curl_strerror(*piVar33,extramsg,0x50);
            pcVar24 = extramsg;
            if (extramsg[0] != '\0') goto LAB_00141021;
          }
          pcVar24 = SSL_ERROR_to_str(iVar14);
LAB_00141021:
          Curl_failf(data,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar24,pcVar23,
                     (long)iVar20);
          return CURLE_SSL_CONNECT_ERROR;
        }
        conn->ssl[lVar21].connecting_state = ssl_connect_2_reading;
      }
    }
    sVar48 = conn->ssl[lVar21].connecting_state;
    if ((nonblocking) && (sVar48 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar48 == ssl_connect_3) {
    if (((conn->http_proxy).proxytype == '\x02') &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      bVar10 = (conn->proxy_ssl_config).field_0x71;
    }
    else {
      bVar10 = (conn->ssl_config).field_0x71;
    }
    bVar11 = 1;
    if ((bVar10 & 1) == 0) {
      bVar11 = (bVar10 & 2) >> 1;
    }
    memset(extramsg,0,0x100);
    pBVar28 = BIO_s_mem();
    pBVar29 = BIO_new(pBVar28);
    if (pBVar29 == (BIO *)0x0) {
      uVar26 = ERR_get_error();
      ossl_strerror(uVar26,extramsg,size_01);
      Curl_failf(data,"BIO_new return NULL, OpenSSL error %s",extramsg);
      return CURLE_OUT_OF_MEMORY;
    }
    psVar3 = conn->ssl[lVar21].backend;
    if (((data->set).ssl.field_0xb8 & 1) != 0) {
      Curl_ossl_certchain(data,psVar3->handle);
    }
    pXVar30 = (X509 *)SSL_get1_peer_certificate(psVar3->handle);
    psVar3->server_cert = pXVar30;
    if (pXVar30 == (X509 *)0x0) {
      BIO_free(pBVar29);
      if (bVar11 != 0) {
        Curl_failf(data,"SSL: couldn\'t get peer certificate");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == '\x02') {
        pcVar23 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar23 = "Server";
        }
      }
      else {
        pcVar23 = "Server";
      }
      Curl_infof(data,"%s certificate:",pcVar23);
      pXVar31 = X509_get_subject_name((X509 *)psVar3->server_cert);
      iVar14 = x509_name_oneline((X509_NAME *)pXVar31,error_buffer,size_02);
      pcVar23 = "[NONE]";
      if (iVar14 == 0) {
        pcVar23 = error_buffer;
      }
      Curl_infof(data," subject: %s",pcVar23);
      pAVar32 = (ASN1_TIME *)X509_get0_notBefore(psVar3->server_cert);
      ASN1_TIME_print(pBVar29,pAVar32);
      uVar26 = BIO_ctrl(pBVar29,3,0,&local_958);
      Curl_infof(data," start date: %.*s",uVar26 & 0xffffffff);
      BIO_ctrl(pBVar29,1,0,(void *)0x0);
      pAVar32 = (ASN1_TIME *)X509_get0_notAfter(psVar3->server_cert);
      ASN1_TIME_print(pBVar29,pAVar32);
      uVar26 = BIO_ctrl(pBVar29,3,0,&local_958);
      Curl_infof(data," expire date: %.*s",uVar26 & 0xffffffff);
      BIO_ctrl(pBVar29,1,0,(void *)0x0);
      BIO_free(pBVar29);
      if (((conn->http_proxy).proxytype == '\x02') &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        bVar10 = (conn->proxy_ssl_config).field_0x71;
      }
      else {
        bVar10 = (conn->ssl_config).field_0x71;
      }
      if (((bVar10 & 2) != 0) &&
         (CVar16 = Curl_ossl_verifyhost(data,conn,psVar3->server_cert), CVar16 != CURLE_OK)) {
        X509_free((X509 *)psVar3->server_cert);
        psVar3->server_cert = (X509 *)0x0;
        return CVar16;
      }
      CVar16 = CURLE_PEER_FAILED_VERIFICATION;
      pXVar31 = X509_get_issuer_name((X509 *)psVar3->server_cert);
      iVar14 = x509_name_oneline((X509_NAME *)pXVar31,error_buffer,size_03);
      if (iVar14 == 0) {
        Curl_infof(data," issuer: %s",error_buffer);
        if (((conn->http_proxy).proxytype == '\x02') &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar35 = (conn->proxy_ssl_config).issuercert_blob;
          if ((conn->proxy_ssl_config).issuercert == (char *)0x0) goto LAB_001415b0;
LAB_00140e60:
          if (pcVar35 != (curl_blob *)0x0) goto LAB_001415b9;
          pBVar28 = BIO_s_file();
          pBVar29 = BIO_new(pBVar28);
          if (pBVar29 == (BIO *)0x0) {
            uVar26 = ERR_get_error();
            ossl_strerror(uVar26,extramsg,size_05);
            pcVar23 = "BIO_new return NULL, OpenSSL error %s";
            goto LAB_00141977;
          }
          if (((conn->http_proxy).proxytype != '\x02') ||
             (lVar41 = 0x318, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar41 = 0x2a0;
          }
          lVar41 = BIO_ctrl(pBVar29,0x6c,3,*(void **)((conn->chunk).hexbuffer + lVar41 + -0x3d));
          if ((int)lVar41 < 1) {
            if (bVar11 != 0) {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar21 = 0x318,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar21 = 0x2a0;
              }
              Curl_failf(data,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((conn->chunk).hexbuffer + lVar21 + -0x3d));
            }
            BIO_free(pBVar29);
            goto LAB_0014171f;
          }
LAB_001415d0:
          pXVar40 = PEM_read_bio_X509(pBVar29,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar40 == (X509 *)0x0) {
            if (bVar11 != 0) {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar21 = 0x318,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar21 = 0x2a0;
              }
              Curl_failf(data,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((conn->chunk).hexbuffer + lVar21 + -0x3d));
            }
            BIO_free(pBVar29);
            pXVar40 = (X509 *)0x0;
          }
          else {
            iVar14 = X509_check_issued(pXVar40,(X509 *)psVar3->server_cert);
            if (iVar14 == 0) {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar41 = 0x318,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar41 = 0x2a0;
              }
              Curl_infof(data," SSL certificate issuer check ok (%s)",
                         *(undefined8 *)((conn->chunk).hexbuffer + lVar41 + -0x3d));
              BIO_free(pBVar29);
              X509_free(pXVar40);
              goto LAB_001417b0;
            }
            if (bVar11 != 0) {
              if (((conn->http_proxy).proxytype != '\x02') ||
                 (lVar21 = 0x318,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar21 = 0x2a0;
              }
              Curl_failf(data,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((conn->chunk).hexbuffer + lVar21 + -0x3d));
            }
            BIO_free(pBVar29);
          }
          X509_free(pXVar40);
LAB_0014171f:
          X509_free((X509 *)psVar3->server_cert);
          psVar3->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
        pcVar35 = (conn->ssl_config).issuercert_blob;
        if ((conn->ssl_config).issuercert != (char *)0x0) goto LAB_00140e60;
LAB_001415b0:
        if (pcVar35 != (curl_blob *)0x0) {
LAB_001415b9:
          pBVar29 = BIO_new_mem_buf(pcVar35->data,(int)pcVar35->len);
          if (pBVar29 == (BIO *)0x0) {
            uVar26 = ERR_get_error();
            ossl_strerror(uVar26,extramsg,size_04);
            pcVar23 = "BIO_new_mem_buf NULL, OpenSSL error %s";
LAB_00141977:
            Curl_failf(data,pcVar23,extramsg);
            X509_free((X509 *)psVar3->server_cert);
            psVar3->server_cert = (X509 *)0x0;
            return CURLE_OUT_OF_MEMORY;
          }
          goto LAB_001415d0;
        }
LAB_001417b0:
        lVar41 = SSL_get_verify_result((SSL *)psVar3->handle);
        if ((conn->http_proxy).proxytype == '\x02') {
          if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
            (data->set).ssl.certverifyresult = lVar41;
            goto LAB_001417fd;
          }
          (data->set).proxy_ssl.certverifyresult = lVar41;
          if (lVar41 == 0) goto LAB_001419dd;
          bVar10 = (conn->proxy_ssl_config).field_0x71;
        }
        else {
          (data->set).ssl.certverifyresult = lVar41;
LAB_001417fd:
          if (lVar41 == 0) {
LAB_001419dd:
            CVar16 = CURLE_OK;
            Curl_infof(data," SSL certificate verify ok.");
            goto LAB_001419f6;
          }
          bVar10 = (conn->ssl_config).field_0x71;
        }
        if ((bVar10 & 1) == 0) {
          pcVar23 = X509_verify_cert_error_string(lVar41);
          CVar16 = CURLE_OK;
          Curl_infof(data," SSL certificate verify result: %s (%ld), continuing anyway.",pcVar23,
                     lVar41);
        }
        else if (bVar11 != 0) {
          pcVar23 = X509_verify_cert_error_string(lVar41);
          Curl_failf(data,"SSL certificate verify result: %s (%ld)",pcVar23,lVar41);
        }
      }
      else if (bVar11 != 0) {
        Curl_failf(data,"SSL: couldn\'t get X509-issuer name");
      }
LAB_001419f6:
      uVar12 = (conn->http_proxy).proxytype;
      if ((uVar12 == '\x02') &&
         (iVar14 = conn->sock[1], conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete)) {
        if (((conn->proxy_ssl_config).field_0x71 & 4) != 0) {
LAB_00141a45:
          psVar4 = conn->ssl[lVar21].backend;
          lVar41 = SSL_ctrl((SSL *)psVar4->handle,0x46,0,&addr);
          if (addr.__in6_u._0_8_ == 0) {
            pcVar23 = "No OCSP response received";
LAB_00141acc:
            resp = (OCSP_RESPONSE *)0x0;
LAB_00141acf:
            Curl_failf(data,pcVar23);
LAB_00141ad9:
            CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            ssl_sessionid = (void *)addr.__in6_u._0_8_;
            resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&ssl_sessionid,lVar41);
            if (resp == (OCSP_RESPONSE *)0x0) {
              pcVar23 = "Invalid OCSP response";
              goto LAB_00141acc;
            }
            uVar15 = OCSP_response_status(resp);
            if (uVar15 != 0) {
              pcVar23 = OCSP_response_status_str((long)(int)uVar15);
              Curl_failf(data,"Invalid OCSP response status: %s (%d)",pcVar23,(ulong)uVar15);
              goto LAB_00141ad9;
            }
            bs = OCSP_response_get1_basic(resp);
            if (bs == (OCSP_BASICRESP *)0x0) {
              pcVar23 = "Invalid OCSP response";
              goto LAB_00141acf;
            }
            certs = SSL_get_peer_cert_chain((SSL *)psVar4->handle);
            if (certs == (stack_st_X509 *)0x0) {
              pcVar23 = "Could not get peer certificate chain";
LAB_001421a7:
              Curl_failf(data,pcVar23);
              CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
            }
            else {
              pXVar39 = SSL_CTX_get_cert_store((SSL_CTX *)psVar4->ctx);
              iVar14 = OCSP_basic_verify(bs,certs,pXVar39,0);
              if (iVar14 < 1) {
                pcVar23 = "OCSP response verification failed";
                goto LAB_001421a7;
              }
              pXVar40 = (X509 *)SSL_get1_peer_certificate(psVar4->handle);
              if (pXVar40 == (X509 *)0x0) {
                pcVar23 = "Error getting peer certificate";
                goto LAB_001421a7;
              }
              id = (OCSP_CERTID *)0x0;
              iVar14 = 0;
              do {
                iVar20 = OPENSSL_sk_num(certs);
                if (iVar20 <= iVar14) goto LAB_00141d0d;
                issuer = (X509 *)OPENSSL_sk_value(certs,iVar14);
                iVar20 = X509_check_issued(issuer,pXVar40);
                iVar14 = iVar14 + 1;
              } while (iVar20 != 0);
              dgst = EVP_sha1();
              id = OCSP_cert_to_id(dgst,pXVar40,issuer);
LAB_00141d0d:
              X509_free(pXVar40);
              if (id == (OCSP_CERTID *)0x0) {
                pcVar23 = "Error computing OCSP ID";
LAB_0014240f:
                Curl_failf(data,pcVar23);
LAB_0014241e:
                CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
              }
              else {
                iVar14 = OCSP_resp_find_status
                                   (bs,id,&cert_status,&crl_reason,(ASN1_GENERALIZEDTIME **)&rev,
                                    (ASN1_GENERALIZEDTIME **)&thisupd,&local_950);
                OCSP_CERTID_free(id);
                if (iVar14 != 1) {
                  pcVar23 = "Could not find certificate ID in OCSP response";
                  goto LAB_0014240f;
                }
                iVar14 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)thisupd,local_950,300,-1);
                if (iVar14 == 0) {
                  pcVar23 = "OCSP response has expired";
                  goto LAB_0014240f;
                }
                pcVar23 = OCSP_cert_status_str((long)cert_status);
                Curl_infof(data,"SSL certificate status: %s (%d)",pcVar23,(ulong)(uint)cert_status);
                CVar16 = cert_status;
                if (cert_status != 0) {
                  if (cert_status != 1) {
                    CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
                    goto LAB_0014242c;
                  }
                  pcVar23 = OCSP_crl_reason_str((long)crl_reason);
                  Curl_failf(data,"SSL certificate revocation reason: %s (%d)",pcVar23,
                             (ulong)(uint)crl_reason);
                  goto LAB_0014241e;
                }
              }
            }
LAB_0014242c:
            OCSP_BASICRESP_free(bs);
          }
          OCSP_RESPONSE_free(resp);
          if (CVar16 != CURLE_OK) {
            X509_free((X509 *)psVar3->server_cert);
            psVar3->server_cert = (X509 *)0x0;
            return CVar16;
          }
          uVar12 = (conn->http_proxy).proxytype;
          CVar16 = CURLE_OK;
          goto LAB_00141b11;
        }
        CVar19 = CURLE_OK;
        if (bVar11 != 0) {
          CVar19 = CVar16;
        }
LAB_00141b2c:
        lVar41 = (ulong)(conn->proxy_ssl[iVar14 != -1].state != ssl_connection_complete) * 8 + 0x820
        ;
      }
      else {
        if (((conn->ssl_config).field_0x71 & 4) != 0) goto LAB_00141a45;
LAB_00141b11:
        CVar19 = CURLE_OK;
        if (bVar11 != 0) {
          CVar19 = CVar16;
        }
        lVar41 = 0x820;
        if (uVar12 == '\x02') {
          iVar14 = conn->sock[1];
          goto LAB_00141b2c;
        }
      }
      pcVar23 = *(char **)((long)&data->magic + lVar41);
      local_958 = pcVar23;
      if ((CVar19 == CURLE_OK) && (pcVar23 != (char *)0x0)) {
        pXVar30 = psVar3->server_cert;
        if (pXVar30 == (X509 *)0x0) {
LAB_00141c19:
          CVar19 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
        }
        else {
          pXVar38 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
          uVar15 = i2d_X509_PUBKEY(pXVar38,(uchar **)0x0);
          if ((int)uVar15 < 1) goto LAB_00141c19;
          uVar26 = (ulong)uVar15;
          pubkey = (uchar *)(*Curl_cmalloc)(uVar26);
          addr.__in6_u._0_8_ = pubkey;
          if (pubkey == (uchar *)0x0) goto LAB_00141c19;
          pXVar38 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar30);
          uVar18 = i2d_X509_PUBKEY(pXVar38,(uchar **)&addr);
          if ((addr.__in6_u._0_8_ == 0 || uVar15 != uVar18) ||
              addr.__in6_u._0_8_ - (long)pubkey != uVar26) {
            CVar19 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            CVar19 = Curl_pin_peer_pubkey(data,pcVar23,pubkey,uVar26);
          }
          (*Curl_cfree)(pubkey);
          if (CVar19 == CURLE_OK) {
            CVar19 = CURLE_OK;
            goto LAB_00141c33;
          }
        }
        Curl_failf(data,"SSL: public key does not match pinned public key");
      }
LAB_00141c33:
      X509_free((X509 *)psVar3->server_cert);
      psVar3->server_cert = (X509 *)0x0;
      conn->ssl[lVar21].connecting_state = ssl_connect_done;
      if (CVar19 != CURLE_OK) {
        return CVar19;
      }
    }
  }
  else if (sVar48 != ssl_connect_done) {
    _Var13 = false;
    goto LAB_00140774;
  }
  conn->ssl[lVar21].state = ssl_connection_complete;
  conn->recv[local_970] = ossl_recv;
  conn->send[local_970] = ossl_send;
  _Var13 = true;
LAB_00140774:
  *local_978 = _Var13;
  conn->ssl[lVar21].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct Curl_easy *data,
                                    struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time is already up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(data, conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(data, conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(data, conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}